

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Request::SetRequestType(Request *this)

{
  headers_t pcVar1;
  type pEVar2;
  handle_t pCVar3;
  Exception *this_00;
  __cxx11 local_50 [32];
  string local_30 [32];
  Request *local_10;
  Request *this_local;
  
  local_10 = this;
  switch(this->request_type_) {
  case GET:
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x50,1);
    break;
  case PUT:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2e,1);
    break;
  case POST:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2e,0);
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2f,1);
    break;
  case HEAD:
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2c,1);
    break;
  case DELETE:
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2734,"DELETE");
    break;
  case PATCH:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2734,"PATCH");
    break;
  case OPTIONS:
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x2734,"OPTIONS");
    break;
  case POST_MIME:
    InitMime(this);
    pEVar2 = std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::
             operator*(&this->eh_);
    pCVar3 = EasyHandle::operator_cast_to_void_(pEVar2);
    curl_easy_setopt(pCVar3,0x281d,this->mime_);
    break;
  default:
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(local_50,this->request_type_);
    std::operator+((char *)local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unsupported request type");
    Exception::Exception(this_00,local_30);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void SetRequestType() {
            switch(request_type_) {
                case RequestType::GET:
                    curl_easy_setopt(*eh_, CURLOPT_HTTPGET, 1L);
                    break;
                case RequestType::PUT:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 1L);
                    break;
                case RequestType::POST:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 0L);
                    curl_easy_setopt(*eh_, CURLOPT_POST, 1L);
                    break;
                case RequestType::HEAD:
                    curl_easy_setopt(*eh_, CURLOPT_NOBODY, 1L);
                    break;
                case RequestType::OPTIONS:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "OPTIONS");
                    break;
                case RequestType::PATCH:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "PATCH");
                    break;
                case RequestType::DELETE:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "DELETE");
                    break;
                case RequestType::POST_MIME:
                    InitMime();
                    curl_easy_setopt(*eh_, CURLOPT_MIMEPOST, mime_);
                    break;
                default:
                    throw Exception("Unsupported request type" + std::to_string(static_cast<int>(request_type_)));
            }
        }